

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall
ImgfsFile::SectionEntry::SectionEntry(SectionEntry *this,uint64_t ofs,uint8_t *pdata)

{
  uint32_t uVar1;
  string *__return_storage_ptr__;
  uchar *puVar2;
  undefined8 uVar3;
  string local_50;
  uint8_t *local_20;
  uint8_t *pdata_local;
  uint64_t ofs_local;
  SectionEntry *this_local;
  
  local_20 = pdata;
  pdata_local = (uint8_t *)ofs;
  ofs_local = (uint64_t)this;
  DirEntry::DirEntry(&this->super_DirEntry,ofs);
  (this->super_DirEntry)._vptr_DirEntry = (_func_int **)&PTR__SectionEntry_0019c248;
  nameinfo::nameinfo(&this->_name,local_20 + 0xc);
  uVar1 = get32le<unsigned_char_const*>(local_20);
  (this->super_DirEntry)._magic = uVar1;
  if ((this->super_DirEntry)._magic != 0xfffff6fd) {
    __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
    uVar1 = DirEntry::offset(&this->super_DirEntry);
    stringformat_abi_cxx11_
              (__return_storage_ptr__,"SectionEntry@%08x: invalid magic: %08x",(ulong)uVar1,
               (ulong)(this->super_DirEntry)._magic);
    __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string
               );
  }
  uVar1 = get32le<unsigned_char_const*>(local_20 + 4);
  this->_datatable = uVar1;
  uVar1 = get32le<unsigned_char_const*>(local_20 + 8);
  this->_nextsection = uVar1;
  uVar1 = get32le<unsigned_char_const*>(local_20 + 0x18);
  (this->super_DirEntry)._size = uVar1;
  uVar1 = get32le<unsigned_char_const*>(local_20 + 0x1c);
  (this->super_DirEntry)._indexptr = uVar1;
  uVar1 = get32le<unsigned_char_const*>(local_20 + 0x20);
  (this->super_DirEntry)._indexsize = uVar1;
  puVar2 = std::
           find_if<unsigned_char_const*,ImgfsFile::SectionEntry::SectionEntry(unsigned_long,unsigned_char_const*)::_lambda(unsigned_char)_1_>
                     (local_20 + 0x24,local_20 + 0x34);
  if (puVar2 != local_20 + 0x34) {
    uVar1 = DirEntry::offset(&this->super_DirEntry);
    hexdump<unsigned_char_const*>(&local_50,local_20 + 0x24,0x10,1,ET_LITTLEENDIAN);
    uVar3 = std::__cxx11::string::c_str();
    printf("WARNING: %08x :sectionent+24 not nul: %s\n",(ulong)uVar1,uVar3);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if (this->_datatable != 0) {
    uVar1 = DirEntry::offset(&this->super_DirEntry);
    printf("WARNING: %08x : sectionent datatable=%08x\n",(ulong)uVar1,(ulong)this->_datatable);
  }
  return;
}

Assistant:

SectionEntry(uint64_t ofs, const uint8_t *pdata)
            : DirEntry(ofs), _name(pdata+12)
        {
            _magic= get32le(pdata);
            if (_magic!=MAGIC)
                throw stringformat("SectionEntry@%08x: invalid magic: %08x", offset(), _magic);
            _datatable= get32le(pdata+4);
            _nextsection= get32le(pdata+8);
            //name : pdata+12
            _size= get32le(pdata+24);
            _indexptr= get32le(pdata+28);
            _indexsize= get32le(pdata+32);

            if (std::find_if(pdata+36, pdata+36+16, [](uint8_t t) { return t!=0; })!=pdata+36+16)
                printf("WARNING: %08x :sectionent+24 not nul: %s\n", offset(), hexdump(pdata+36, 16).c_str());
            if (_datatable)
                printf("WARNING: %08x : sectionent datatable=%08x\n", offset(), _datatable);

        }